

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_date_only<toml::type_config>
            (result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  value_type *pvVar6;
  tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *this;
  allocator<char> local_7c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  result<int,_toml::detail::none_t> day_r;
  result<int,_toml::detail::none_t> month_r;
  result<int,_toml::detail::none_t> year_r;
  string str;
  source_location src;
  undefined1 local_6d0 [104];
  string local_668;
  string local_648;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string local_548;
  location first;
  region reg;
  location local_478;
  source_location local_430;
  source_location local_3b8;
  source_location local_340;
  source_location local_2c8;
  error_info local_250;
  error_info local_1f8;
  error_info local_1a0;
  error_info local_148;
  error_info local_f0;
  region local_98;
  
  location::location(&first,loc);
  syntax::local_date((sequence *)&src,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&src,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &src.first_line_);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,
               "toml::parse_local_date: invalid date: date must be like: 1234-05-06, yyyy-mm-dd.",
               (allocator<char> *)&str);
    syntax::local_date((sequence *)local_6d0,&ctx->toml_spec_);
    location::location(&local_478,loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"",(allocator<char> *)&local_7c0);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)&src,&local_548,(sequence *)local_6d0,&local_478,&local_568);
    err<toml::error_info>((failure<toml::error_info> *)&local_f0,(error_info *)&src);
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_f0);
    error_info::~error_info(&local_f0);
    error_info::~error_info((error_info *)&src);
    std::__cxx11::string::~string((string *)&local_568);
    location::~location(&local_478);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_6d0 + 8));
    this = &local_548;
    goto LAB_002fb5ad;
  }
  region::as_string_abi_cxx11_(&str,&reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,4);
  from_string<int>((detail *)&year_r,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,5,2);
  from_string<int>((detail *)&month_r,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,8,2);
  from_string<int>((detail *)&day_r,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  if (year_r.is_ok_ == false) {
    region::region((region *)local_6d0,&first);
    source_location::source_location(&src,(region *)local_6d0);
    region::~region((region *)local_6d0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_7a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
               0,4);
    std::operator+(&local_7c0,"toml::parse_local_date: failed to read year `",&local_7a0);
    std::operator+(&local_588,&local_7c0,"`");
    source_location::source_location(&local_2c8,&src);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"here",&local_7c1);
    make_error_info<>((error_info *)local_6d0,(string *)&local_588,&local_2c8,&local_5a8);
    err<toml::error_info>((failure<toml::error_info> *)&local_148,(error_info *)local_6d0);
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_148);
    error_info::~error_info(&local_148);
    error_info::~error_info((error_info *)local_6d0);
    std::__cxx11::string::~string((string *)&local_5a8);
    source_location::~source_location(&local_2c8);
    pbVar7 = &local_588;
LAB_002fb582:
    std::__cxx11::string::~string((string *)pbVar7);
    std::__cxx11::string::~string((string *)&local_7c0);
    pbVar7 = &local_7a0;
LAB_002fb596:
    std::__cxx11::string::~string((string *)pbVar7);
    source_location::~source_location(&src);
  }
  else {
    if (month_r.is_ok_ == false) {
      region::region((region *)local_6d0,&first);
      source_location::source_location(&src,(region *)local_6d0);
      region::~region((region *)local_6d0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_7a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,5,2);
      std::operator+(&local_7c0,"toml::parse_local_date: failed to read month `",&local_7a0);
      std::operator+(&local_5c8,&local_7c0,"`");
      source_location::source_location(&local_340,&src);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"here",&local_7c1);
      make_error_info<>((error_info *)local_6d0,(string *)&local_5c8,&local_340,&local_5e8);
      err<toml::error_info>((failure<toml::error_info> *)&local_1a0,(error_info *)local_6d0);
      result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_1a0);
      error_info::~error_info(&local_1a0);
      error_info::~error_info((error_info *)local_6d0);
      std::__cxx11::string::~string((string *)&local_5e8);
      source_location::~source_location(&local_340);
      pbVar7 = &local_5c8;
      goto LAB_002fb582;
    }
    if (day_r.is_ok_ == false) {
      region::region((region *)local_6d0,&first);
      source_location::source_location(&src,(region *)local_6d0);
      region::~region((region *)local_6d0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_7a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,8,2);
      std::operator+(&local_7c0,"toml::parse_local_date: failed to read day `",&local_7a0);
      std::operator+(&local_608,&local_7c0,"`");
      source_location::source_location(&local_3b8,&src);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"here",&local_7c1);
      make_error_info<>((error_info *)local_6d0,(string *)&local_608,&local_3b8,&local_628);
      err<toml::error_info>((failure<toml::error_info> *)&local_1f8,(error_info *)local_6d0);
      result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_1f8);
      error_info::~error_info(&local_1f8);
      error_info::~error_info((error_info *)local_6d0);
      std::__cxx11::string::~string((string *)&local_628);
      source_location::~source_location(&local_3b8);
      pbVar7 = &local_608;
      goto LAB_002fb582;
    }
    puVar5 = (uint *)result<int,_toml::detail::none_t>::unwrap(&year_r,(source_location)0x45c280);
    uVar1 = *puVar5;
    puVar5 = (uint *)result<int,_toml::detail::none_t>::unwrap(&month_r,(source_location)0x45c298);
    uVar2 = *puVar5;
    pvVar6 = result<int,_toml::detail::none_t>::unwrap(&day_r,(source_location)0x45c2b0);
    iVar3 = *pvVar6;
    if ((uVar1 & 3) == 0) {
      if ((int)uVar1 % 100 == 0) {
        iVar4 = ((int)uVar1 % 400 == 0) + 0x1c;
      }
      else {
        iVar4 = 0x1d;
      }
    }
    else {
      iVar4 = 0x1c;
    }
    if (uVar2 < 0xc) {
      if ((0xa50U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 2) goto LAB_002fb796;
      }
      else {
        iVar4 = 0x1e;
      }
    }
    else {
LAB_002fb796:
      iVar4 = 0x1f;
    }
    if (((uVar2 - 0xd < 0xfffffff4) || (iVar3 < 1)) || (iVar4 < iVar3)) {
      region::region((region *)local_6d0,&first);
      source_location::source_location(&src,(region *)local_6d0);
      region::~region((region *)local_6d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,"toml::parse_local_date: invalid date.",
                 (allocator<char> *)&local_7c0);
      source_location::source_location(&local_430,&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,
                 "month must be 01-12, day must be any of 01-28,29,30,31 depending on the month/year."
                 ,(allocator<char> *)&local_7a0);
      make_error_info<>((error_info *)local_6d0,&local_648,&local_430,&local_668);
      err<toml::error_info>((failure<toml::error_info> *)&local_250,(error_info *)local_6d0);
      result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)&local_250);
      error_info::~error_info(&local_250);
      error_info::~error_info((error_info *)local_6d0);
      std::__cxx11::string::~string((string *)&local_668);
      source_location::~source_location(&local_430);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648;
      goto LAB_002fb596;
    }
    region::region((region *)&src,&reg);
    src.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         uVar1 & 0xffff | uVar2 * 0x10000 + 0xff0000 & 0xff0000 | iVar3 << 0x18;
    ok<std::tuple<toml::local_date,toml::local_date_format_info,toml::detail::region>>
              ((success<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>_>
                *)&local_98,(toml *)&src,v);
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(success_type *)&local_98);
    region::~region(&local_98);
    region::~region((region *)&src);
  }
  this = &str;
LAB_002fb5ad:
  std::__cxx11::string::~string((string *)this);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<std::tuple<local_date, local_date_format_info, region>, error_info>
parse_local_date_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_date_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_date(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_local_date: "
            "invalid date: date must be like: 1234-05-06, yyyy-mm-dd.",
            syntax::local_date(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // 0123456789
    // yyyy-mm-dd
    const auto year_r  = from_string<int>(str.substr(0, 4));
    const auto month_r = from_string<int>(str.substr(5, 2));
    const auto day_r   = from_string<int>(str.substr(8, 2));

    if(year_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read year `" + str.substr(0, 4) + "`",
            std::move(src), "here"));
    }
    if(month_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read month `" + str.substr(5, 2) + "`",
            std::move(src), "here"));
    }
    if(day_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read day `" + str.substr(8, 2) + "`",
            std::move(src), "here"));
    }

    const auto year  = year_r.unwrap();
    const auto month = month_r.unwrap();
    const auto day   = day_r.unwrap();

    {
        // We briefly check whether the input date is valid or not.
        //     Actually, because of the historical reasons, there are several
        // edge cases, such as 1582/10/5-1582/10/14 (only in several countries).
        // But here, we do not care about it.
        // It makes the code complicated and there is only low probability
        // that such a specific date is needed in practice. If someone need to
        // validate date accurately, that means that the one need a specialized
        // library for their purpose in another layer.

        const bool is_leap = (year % 4 == 0) && ((year % 100 != 0) || (year % 400 == 0));
        const auto max_day = [month, is_leap]() {
            if(month == 2)
            {
                return is_leap ? 29 : 28;
            }
            if(month == 4 || month == 6 || month == 9 || month == 11)
            {
                return 30;
            }
            return 31;
        }();

        if((month < 1 || 12 < month) || (day < 1 || max_day < day))
        {
            auto src = source_location(region(first));
            return err(make_error_info("toml::parse_local_date: invalid date.",
                std::move(src), "month must be 01-12, day must be any of "
                "01-28,29,30,31 depending on the month/year."));
        }
    }

    return ok(std::make_tuple(
            local_date(year, static_cast<month_t>(month - 1), day),
            std::move(fmt), std::move(reg)
        ));
}